

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O3

int per_binding(hash_key_t key,hash_data_t data,void *opaque)

{
  internal_binding_t *piVar1;
  internal_binding_t *piVar2;
  int iVar3;
  undefined8 in_RAX;
  
  if (2 < debug_level) {
    per_binding_cold_1();
  }
  piVar2 = *(internal_binding_t **)((long)data + 0x10);
  iVar3 = debug_level;
  while (piVar1 = piVar2, piVar1 != (internal_binding_t *)0x0) {
    if (2 < iVar3) {
      per_binding_cold_2();
      iVar3 = (int)((ulong)in_RAX >> 0x20);
    }
    data = piVar1;
    piVar2 = piVar1->next_binding;
  }
  iVar3 = prepare_symbol((internal_binding_t *)data);
  if (iVar3 == -1) {
    if (2 < debug_level) {
      per_binding_cold_3();
    }
  }
  else {
    removefrom_hashtable(&notfound_binding_table,key);
  }
  return 0;
}

Assistant:

static int per_binding(hash_key_t key, hash_data_t data, void *opaque KNOWN_UNUSED)
{
   int result;
   struct internal_binding_t *binding = (struct internal_binding_t *) data;

   debug_printf(3, "Trying to re-bind %s from tool %s after dlopen\n",
                binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   
   while (binding->next_binding) {
      binding = binding->next_binding;
      debug_printf(3, "Selecting new innermost version of binding %s from tool %s.\n",
                   binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   }
   
   result = prepare_symbol(binding);
   if (result == -1) {
      debug_printf(3, "Still could not prepare binding %s after dlopen\n", binding->user_binding->name);
      return 0;
   }

   removefrom_hashtable(&notfound_binding_table, key);
   return 0;
}